

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<const_frozen::basic_string<char16_t>_&,_const_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_&>
::streamReconstructedExpression
          (BinaryExpr<const_frozen::basic_string<char16_t>_&,_const_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  basic_string<char16_t> *in_RDX;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *range;
  string *in_R9;
  StringRef op;
  string local_60;
  string local_40;
  
  rangeToString<frozen::basic_string<char16_t>>(&local_40,(Catch *)this->m_lhs,in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  rangeToString<std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            (&local_60,(Catch *)this->m_rhs,range);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }